

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

bool __thiscall google::protobuf::io::Printer::Next(Printer *this)

{
  uint uVar1;
  char *local_20;
  void *void_buffer;
  Printer *this_local;
  
  void_buffer = this;
  do {
    uVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                      (this->output_,&local_20,&this->buffer_size_);
    if ((uVar1 & 1) == 0) {
      this->failed_ = true;
      return false;
    }
    this->buffer_ = local_20;
  } while (this->buffer_size_ == 0);
  return true;
}

Assistant:

bool Printer::Next() {
  do {
    void* void_buffer;
    if (!output_->Next(&void_buffer, &buffer_size_)) {
      failed_ = true;
      return false;
    }
    buffer_ = reinterpret_cast<char*>(void_buffer);
  } while (buffer_size_ == 0);
  return true;
}